

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_seek(PHYSFS_File *handle,PHYSFS_uint64 pos)

{
  int iVar1;
  PHYSFS_sint64 PVar2;
  void *pvVar3;
  ulong uVar4;
  
  iVar1 = PHYSFS_flush(handle);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((handle[3].opaque == (void *)0x0) || (*(char *)&handle[1].opaque == '\0')) {
LAB_001097c4:
      handle[5].opaque = (void *)0x0;
      handle[6].opaque = (void *)0x0;
      iVar1 = (**(code **)((long)handle->opaque + 0x20))(handle->opaque,pos);
      return iVar1;
    }
    PVar2 = PHYSFS_tell(handle);
    uVar4 = pos - PVar2;
    if ((long)uVar4 < 0) {
      pvVar3 = handle[6].opaque;
      if (pvVar3 < (void *)-uVar4) goto LAB_001097c4;
    }
    else {
      pvVar3 = handle[6].opaque;
      if ((ulong)((long)handle[5].opaque - (long)pvVar3) < uVar4) goto LAB_001097c4;
    }
    handle[6].opaque = (void *)((long)pvVar3 + uVar4);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int PHYSFS_seek(PHYSFS_File *handle, PHYSFS_uint64 pos)
{
    FileHandle *fh = (FileHandle *) handle;
    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), 0);

    if (fh->buffer && fh->forReading)
    {
        /* avoid throwing away our precious buffer if seeking within it. */
        PHYSFS_sint64 offset = pos - PHYSFS_tell(handle);
        if ( /* seeking within the already-buffered range? */
             /* forward? */
            ((offset >= 0) && (((size_t)offset) <= fh->buffill-fh->bufpos)) ||
            /* backward? */
            ((offset < 0) && (((size_t) -offset) <= fh->bufpos)) )
        {
            fh->bufpos = (size_t) (((PHYSFS_sint64) fh->bufpos) + offset);
            return 1; /* successful seek */
        } /* if */
    } /* if */

    /* we have to fall back to a 'raw' seek. */
    fh->buffill = fh->bufpos = 0;
    return fh->io->seek(fh->io, pos);
}